

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.hpp
# Opt level: O3

bool __thiscall just::test::test_manager::run(test_manager *this,ostream *report_)

{
  pointer ptVar1;
  bool bVar2;
  ostream *poVar3;
  long lVar4;
  int iVar5;
  char *pcVar6;
  pointer this_00;
  
  this_00 = (this->_cases).
            super__Vector_base<just::test::test_case,_std::allocator<just::test::test_case>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ptVar1 = (this->_cases).
           super__Vector_base<just::test::test_case,_std::allocator<just::test::test_case>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (this_00 == ptVar1) {
    iVar5 = 0;
  }
  else {
    iVar5 = 0;
    do {
      bVar2 = test_case::run(this_00,report_);
      iVar5 = iVar5 + (uint)!bVar2;
      this_00 = this_00 + 1;
    } while (this_00 != ptVar1);
  }
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)report_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," test cases finished.",0x15);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if (iVar5 < 1) {
    pcVar6 = "  All succeeded.";
    lVar4 = 0x10;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(report_,"  ",2);
    report_ = (ostream *)std::ostream::operator<<((ostream *)report_,iVar5);
    pcVar6 = " failed.";
    lVar4 = 8;
  }
  std::__ostream_insert<char,std::char_traits<char>>(report_,pcVar6,lVar4);
  std::ios::widen((char)*(undefined8 *)(*(long *)report_ + -0x18) + (char)report_);
  std::ostream::put((char)report_);
  std::ostream::flush();
  return iVar5 == 0;
}

Assistant:

bool run(std::ostream& report_) const
      {
        int failures = 0;
        for (
          std::vector<test_case>::const_iterator
            i = _cases.begin(),
            e = _cases.end();
          i != e;
          ++i
        )
        {
          if (!i->run(report_))
          {
            ++failures;
          }
        }
        report_ << _cases.size() << " test cases finished." << std::endl;
        if (failures > 0)
        {
          report_ << "  " << failures << " failed." << std::endl;
        }
        else
        {
          report_ << "  All succeeded." << std::endl;
        }
        return failures == 0;
      }